

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O2

void __thiscall SchemeFilePort::~SchemeFilePort(SchemeFilePort *this)

{
  SchemeFilePort *local_10;
  
  (this->super_SchemePort).super_SchemeObject._vptr_SchemeObject =
       (_func_int **)&PTR__SchemeFilePort_00165578;
  local_10 = this;
  std::
  _Rb_tree<SchemeFilePort_*,_SchemeFilePort_*,_std::_Identity<SchemeFilePort_*>,_std::less<SchemeFilePort_*>,_std::allocator<SchemeFilePort_*>_>
  ::erase(&open_files._M_t,&local_10);
  SchemePort::~SchemePort(&this->super_SchemePort);
  return;
}

Assistant:

SchemeFilePort::~SchemeFilePort()
{
    open_files.erase(this);
}